

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandRecPs3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint fPrintLib;
  
  fPrintLib = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"ph");
    if (iVar1 != 0x70) break;
    fPrintLib = fPrintLib ^ 1;
  }
  if (iVar1 == -1) {
    iVar1 = 0;
    iVar2 = Abc_NtkRecIsRunning3();
    if (iVar2 == 0) {
      iVar1 = 0;
      Abc_Print(-1,"This command works for AIGs only after calling \"rec_start2\".\n");
    }
    else {
      Abc_NtkRecPs3(fPrintLib);
    }
  }
  else {
    Abc_Print(-2,"usage: rec_ps3 [-h]\n");
    Abc_Print(-2,"\t        prints statistics about the recorded AIG subgraphs\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandRecPs3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fPrintLib = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'p':
            fPrintLib ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "This command works for AIGs only after calling \"rec_start2\".\n" );
        return 0;
    }
    Abc_NtkRecPs3(fPrintLib);
    return 0;

usage:
    Abc_Print( -2, "usage: rec_ps3 [-h]\n" );
    Abc_Print( -2, "\t        prints statistics about the recorded AIG subgraphs\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}